

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_is_connected(Curl_easy *data,connectdata *conn,int sockindex,_Bool *connected)

{
  undefined1 *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  _Bool *connected_00;
  int iVar12;
  CURLcode CVar13;
  _Bool _Var14;
  CURLcode CVar15;
  uint uVar16;
  CURLcode CVar17;
  timediff_t tVar18;
  int *piVar19;
  char *pcVar20;
  Curl_addrinfo *pCVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  bool bVar26;
  curltime cVar27;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  int error;
  char ipaddress [46];
  char buffer [256];
  int local_19c;
  int local_198;
  CURLcode local_194;
  curltime local_190;
  CURLcode local_180;
  uint local_17c;
  _Bool *local_178;
  long local_170;
  char local_168 [48];
  char local_138 [264];
  
  local_19c = 0;
  *connected = false;
  local_170 = (long)sockindex;
  if ((conn->bits).tcpconnect[local_170] == true) {
    *connected = true;
  }
  else {
    cVar27 = Curl_now();
    local_190.tv_sec = cVar27.tv_sec;
    local_190.tv_usec = cVar27.tv_usec;
    if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
      CVar15 = connect_SOCKS(data,sockindex,connected);
      if (CVar15 != CURLE_OK) {
        return CVar15;
      }
      if (*connected != true) {
        return CURLE_OK;
      }
      post_SOCKS(data,conn,sockindex,connected);
      return CURLE_OK;
    }
    CVar15 = CURLE_OK;
    lVar22 = 0;
    local_198 = sockindex;
    local_178 = connected;
    do {
      if (conn->tempsock[lVar22] == -1) {
        iVar25 = 6;
        CVar13 = local_194;
      }
      else {
        uVar24 = (uint)lVar22 ^ 1;
        local_19c = 0;
        uVar16 = Curl_socket_check(-1,-1,conn->tempsock[lVar22],0);
        if (uVar16 == 2) {
LAB_0010ef73:
          _Var14 = verifyconnect(conn->tempsock[lVar22],&local_19c);
          if (!_Var14) goto LAB_0010f030;
          conn->sock[local_170] = conn->tempsock[lVar22];
          pCVar21 = conn->tempaddr[lVar22];
          conn->ip_addr = pCVar21;
          conn->tempsock[lVar22] = -1;
          *(ulong *)&(conn->bits).field_0x4 =
               *(ulong *)&(conn->bits).field_0x4 & 0xffffffffffffdfff |
               (ulong)(pCVar21->ai_family == 10) << 0xd;
          if (conn->tempsock[uVar24] != -1) {
            Curl_closesocket(data,conn,conn->tempsock[uVar24]);
            conn->tempsock[uVar24] = -1;
          }
          connected_00 = local_178;
          CVar17 = connect_SOCKS(data,local_198,local_178);
          iVar25 = 1;
          iVar12 = 1;
          CVar13 = CVar17;
          if (CVar17 == CURLE_OK) {
            CVar15 = CVar17;
            if (*connected_00 == true) {
              post_SOCKS(data,conn,local_198,connected_00);
              local_194 = CURLE_OK;
              CVar15 = CURLE_OK;
              CVar13 = local_194;
            }
            goto LAB_0010f13a;
          }
LAB_0010f137:
          local_194 = CVar13;
          iVar25 = iVar12;
          CVar15 = CVar17;
          CVar13 = local_194;
        }
        else {
          if (uVar16 == 0) {
            cVar27.tv_usec = local_190.tv_usec;
            cVar27.tv_sec = local_190.tv_sec;
            uVar4 = (conn->connecttime).tv_sec;
            uVar5 = (conn->connecttime).tv_usec;
            older.tv_usec = uVar5;
            older.tv_sec = uVar4;
            cVar27._12_4_ = 0;
            older._12_4_ = 0;
            tVar18 = Curl_timediff(cVar27,older);
            if (conn->timeoutms_per_addr[lVar22] <= tVar18) {
              Curl_infof(data,"After %ldms connect time, move on!");
              local_19c = 0x6e;
            }
            if (((lVar22 == 0) && ((*(ulong *)&(conn->bits).field_0x4 & 0x400000000) == 0)) &&
               (newer.tv_usec = local_190.tv_usec, newer.tv_sec = local_190.tv_sec,
               uVar6 = (conn->connecttime).tv_sec, uVar7 = (conn->connecttime).tv_usec,
               older_00.tv_usec = uVar7, older_00.tv_sec = uVar6, newer._12_4_ = 0,
               older_00._12_4_ = 0, tVar18 = Curl_timediff(newer,older_00),
               (data->set).happy_eyeballs_timeout <= tVar18)) {
              puVar1 = &(conn->bits).field_0x4;
              *(ulong *)puVar1 = *(ulong *)puVar1 | 0x400000000;
              trynextip(data,conn,local_198,1);
            }
          }
          else {
            if (((conn->bits).field_0x7 & 4) != 0) goto LAB_0010ef73;
            if ((uVar16 & 4) != 0) {
              verifyconnect(conn->tempsock[lVar22],&local_19c);
            }
          }
LAB_0010f030:
          iVar12 = local_19c;
          iVar25 = 0;
          CVar13 = local_194;
          local_17c = uVar24;
          if (local_19c != 0) {
            (data->state).os_errno = local_19c;
            piVar19 = __errno_location();
            *piVar19 = iVar12;
            iVar25 = 0;
            CVar13 = local_194;
            if (conn->tempaddr[lVar22] != (Curl_addrinfo *)0x0) {
              local_180 = CVar15;
              Curl_printable_address(conn->tempaddr[lVar22],local_168,0x2e);
              uVar16 = conn->port;
              pcVar20 = Curl_strerror(local_19c,local_138,0x100);
              Curl_infof(data,"connect to %s port %u failed: %s",local_168,(ulong)uVar16,pcVar20);
              tVar18 = Curl_timeleft(data,&local_190,true);
              CVar15 = local_180;
              pCVar21 = conn->tempaddr[lVar22];
              lVar23 = tVar18 / 2;
              if (pCVar21->ai_next == (Curl_addrinfo *)0x0) {
                lVar23 = tVar18;
              }
              conn->timeoutms_per_addr[lVar22] = lVar23;
              if (pCVar21 != (Curl_addrinfo *)0x0) {
                pCVar21 = pCVar21->ai_next;
              }
              if (pCVar21 != (Curl_addrinfo *)0x0) {
                do {
                  if (pCVar21->ai_family == conn->tempfamily[lVar22]) break;
                  pCVar21 = pCVar21->ai_next;
                } while (pCVar21 != (Curl_addrinfo *)0x0);
              }
              conn->tempaddr[lVar22] = pCVar21;
              CVar17 = trynextip(data,conn,local_198,(uint)lVar22);
              iVar12 = 0;
              CVar13 = local_194;
              if ((CVar17 != CURLE_COULDNT_CONNECT) || (conn->tempsock[local_17c] == -1))
              goto LAB_0010f137;
            }
          }
        }
      }
LAB_0010f13a:
      local_194 = CVar13;
      if ((iVar25 != 6) && (iVar25 != 0)) {
        return local_194;
      }
      bVar26 = lVar22 == 0;
      lVar22 = lVar22 + 1;
    } while (bVar26);
    tVar18 = Curl_timeleft(data,&local_190,true);
    if (tVar18 < 0) {
      newer_01.tv_usec = local_190.tv_usec;
      newer_01.tv_sec = local_190.tv_sec;
      uVar10 = (data->progress).t_startsingle.tv_sec;
      uVar11 = (data->progress).t_startsingle.tv_usec;
      older_02.tv_usec = uVar11;
      older_02.tv_sec = uVar10;
      newer_01._12_4_ = 0;
      older_02._12_4_ = 0;
      tVar18 = Curl_timediff(newer_01,older_02);
      Curl_failf(data,"Connection timeout after %ld ms",tVar18);
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (CVar15 == CURLE_OK) {
      return CURLE_OK;
    }
    if (conn->tempsock[0] != -1) {
      return CURLE_OK;
    }
    if (conn->tempsock[1] != -1) {
      return CURLE_OK;
    }
    CVar15 = trynextip(data,conn,local_198,1);
    if (CVar15 != CURLE_OK) {
      uVar2 = *(ulong *)&(conn->bits).field_0x4;
      lVar22 = 0xf0;
      if ((((uVar2 & 2) == 0) && (lVar22 = 0x130, (uVar2 & 1) == 0)) &&
         (lVar22 = 0xd0, ((uint)uVar2 >> 8 & 1) == 0)) {
        lVar22 = 0xa0;
      }
      uVar3 = *(undefined8 *)((conn->chunk).hexbuffer + lVar22 + -0x3d);
      uVar16 = conn->port;
      newer_00.tv_usec = local_190.tv_usec;
      newer_00.tv_sec = local_190.tv_sec;
      uVar8 = (data->progress).t_startsingle.tv_sec;
      uVar9 = (data->progress).t_startsingle.tv_usec;
      older_01.tv_usec = uVar9;
      older_01.tv_sec = uVar8;
      newer_00._12_4_ = 0;
      older_01._12_4_ = 0;
      tVar18 = Curl_timediff(newer_00,older_01);
      pcVar20 = Curl_strerror(local_19c,local_138,0x100);
      Curl_failf(data,"Failed to connect to %s port %u after %ld ms: %s",uVar3,(ulong)uVar16,tVar18,
                 pcVar20);
      if ((data->state).os_errno != 0x6e) {
        return CVar15;
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_is_connected(struct Curl_easy *data,
                           struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc = 0;
  unsigned int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  if(SOCKS_STATE(conn->cnnct.state)) {
    /* still doing SOCKS */
    result = connect_SOCKS(data, sockindex, connected);
    if(!result && *connected)
      post_SOCKS(data, conn, sockindex, connected);
    return result;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;
    error = 0;
#ifdef ENABLE_QUIC
    if(conn->transport == TRNSPRT_QUIC) {
      result = Curl_quic_is_connected(data, conn, i, connected);
      if(!result && *connected) {
        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
        post_SOCKS(data, conn, sockindex, connected);
        connkeep(conn, "HTTP/3 default");
        return CURLE_OK;
      }
      if(result) {
        conn->tempsock[i] = CURL_SOCKET_BAD;
        error = SOCKERRNO;
      }
    }
    else
#endif
    {
#ifdef mpeix
      /* Call this function once now, and ignore the results. We do this to
         "clear" the error state on the socket so that we can later read it
         reliably. This is reported necessary on the MPE/iX operating
         system. */
      (void)verifyconnect(conn->tempsock[i], NULL);
#endif

      /* check socket for connect */
      rc = SOCKET_WRITABLE(conn->tempsock[i], 0);
    }

    if(rc == 0) { /* no connection yet */
      if(Curl_timediff(now, conn->connecttime) >=
         conn->timeoutms_per_addr[i]) {
        infof(data, "After %" CURL_FORMAT_TIMEDIFF_T
              "ms connect time, move on!", conn->timeoutms_per_addr[i]);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && !conn->bits.parallel_connect &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        conn->bits.parallel_connect = TRUE; /* starting now */
        trynextip(data, conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(data, conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to kick off any SOCKS proxy magic once we
           connected */
        result = connect_SOCKS(data, sockindex, connected);
        if(result || !*connected)
          return result;

        post_SOCKS(data, conn, sockindex, connected);

        return CURLE_OK;
      }
    }
    else if(rc & CURL_CSELECT_ERR) {
      (void)verifyconnect(conn->tempsock[i], &error);
    }

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress,
                               sizeof(ipaddress));
        infof(data, "connect to %s port %u failed: %s",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));
#endif

        allow = Curl_timeleft(data, &now, TRUE);
        conn->timeoutms_per_addr[i] = conn->tempaddr[i]->ai_next == NULL ?
          allow : allow / 2;
        ainext(conn, i, TRUE);
        status = trynextip(data, conn, sockindex, i);
        if((status != CURLE_COULDNT_CONNECT) ||
           conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  /*
   * Now that we've checked whether we are connected, check whether we've
   * already timed out.
   *
   * First figure out how long time we have left to connect */

  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection timeout after %ld ms",
          Curl_timediff(now, data->progress.t_startsingle));
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(result &&
     (conn->tempsock[0] == CURL_SOCKET_BAD) &&
     (conn->tempsock[1] == CURL_SOCKET_BAD)) {
    /* no more addresses to try */
    const char *hostname;
    char buffer[STRERROR_LEN];

    /* if the first address family runs out of addresses to try before the
       happy eyeball timeout, go ahead and try the next family now */
    result = trynextip(data, conn, sockindex, 1);
    if(!result)
      return result;

#ifndef CURL_DISABLE_PROXY
    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else
#endif
      if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %u after %ld ms: %s",
        hostname, conn->port,
        Curl_timediff(now, data->progress.t_startsingle),
        Curl_strerror(error, buffer, sizeof(buffer)));

    Curl_quic_disconnect(data, conn, 0);
    Curl_quic_disconnect(data, conn, 1);

#ifdef WSAETIMEDOUT
    if(WSAETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#elif defined(ETIMEDOUT)
    if(ETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#endif
  }
  else
    result = CURLE_OK; /* still trying */

  return result;
}